

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

string * __thiscall
duckdb::Value::ToSQLString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  LogicalTypeId LVar3;
  undefined1 *puVar4;
  long lVar5;
  string *psVar6;
  bool bVar7;
  long *plVar8;
  const_reference __rhs;
  undefined8 *puVar9;
  vector<duckdb::Value,_true> *pvVar10;
  const_reference pvVar11;
  ulong uVar12;
  ulong *puVar13;
  size_type *psVar14;
  char *pcVar15;
  char *pcVar16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  ulong uVar19;
  string str_val;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  string local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  child_list_t<LogicalType> *local_78;
  string local_70;
  string local_50;
  
  if (this->is_null == true) {
switchD_002dd0e1_caseD_15:
    ToString_abi_cxx11_(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  LVar3 = (this->type_).id_;
  switch(LVar3) {
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case BLOB:
  case INTERVAL:
  case TIMESTAMP_TZ:
  case TIME_TZ:
    goto switchD_002dd0e1_caseD_f;
  case DECIMAL:
  case CHAR:
  case UTINYINT:
  case USMALLINT:
  case UINTEGER:
  case UBIGINT:
  case TIMESTAMP_TZ|SQLNULL:
    goto switchD_002dd0e1_caseD_15;
  case FLOAT:
    if (((this->value_).uinteger & 0x7fffffff) < 0x7f800000) goto switchD_002dd0e1_caseD_15;
    ToString_abi_cxx11_(&local_a0,this);
    ::std::operator+(&local_e8,"\'",&local_a0);
    puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_e8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    puVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_108.field_2._M_allocated_capacity = *puVar13;
      local_108.field_2._8_8_ = puVar9[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *puVar13;
      local_108._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_108._M_string_length = puVar9[1];
    *puVar9 = puVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    LogicalType::ToString_abi_cxx11_(&local_c8,&this->type_);
    ::std::operator+(__return_storage_ptr__,&local_108,&local_c8);
    goto LAB_002dda07;
  case DOUBLE:
    dVar2 = (this->value_).double_;
    if ((ulong)ABS(dVar2) < 0x7ff0000000000000) goto switchD_002dd0e1_caseD_15;
    if (!NAN(dVar2)) {
      pcVar16 = "1e1000";
      if (dVar2 < 0.0) {
        pcVar16 = "-1e1000";
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar16,pcVar16 + (ulong)(dVar2 < 0.0) + 6);
      return __return_storage_ptr__;
    }
    ToString_abi_cxx11_(&local_a0,this);
    ::std::operator+(&local_e8,"\'",&local_a0);
    puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_e8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    puVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_108.field_2._M_allocated_capacity = *puVar13;
      local_108.field_2._8_8_ = puVar9[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *puVar13;
      local_108._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_108._M_string_length = puVar9[1];
    *puVar9 = puVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    LogicalType::ToString_abi_cxx11_(&local_c8,&this->type_);
    ::std::operator+(__return_storage_ptr__,&local_108,&local_c8);
LAB_002dda07:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_002dd552;
    goto LAB_002dd557;
  case VARCHAR:
switchD_002dd0e1_caseD_19:
    ToString_abi_cxx11_(&local_108,this);
    if ((local_108._M_string_length == 1) && (*local_108._M_dataplus._M_p == '\0')) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"chr(0)","");
    }
    else {
      ToString_abi_cxx11_(&local_50,this);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"\'","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'\'","");
      StringUtil::Replace(&local_a0,&local_50,&local_c8,&local_70);
      puVar9 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x13728a6);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_e8.field_2._M_allocated_capacity = *puVar13;
        local_e8.field_2._8_8_ = puVar9[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *puVar13;
        local_e8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_e8._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_e8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar14 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar14) {
        lVar5 = plVar8[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
      }
      __return_storage_ptr__->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    psVar6 = &local_108;
    goto LAB_002dd55c;
  }
  switch(LVar3) {
  case STRUCT:
    bVar7 = StructType::IsUnnamed(&this->type_);
    pcVar16 = "{";
    local_80 = &__return_storage_ptr__->field_2;
    local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT71(local_a8._1_7_,bVar7);
    if (bVar7) {
      pcVar16 = "(";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
    pcVar15 = "";
    if (bVar7) {
      pcVar15 = "";
    }
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar16,pcVar15);
    local_78 = StructType::GetChildTypes_abi_cxx11_(&this->type_);
    pvVar10 = StructValue::GetChildren(this);
    if ((pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar19 = 0;
      do {
        __rhs = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                ::operator[](local_78,uVar19);
        pvVar11 = vector<duckdb::Value,_true>::operator[](pvVar10,uVar19);
        if ((char)local_a8 == '\0') {
          ::std::operator+(&local_a0,"\'",&__rhs->first);
          puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_a0);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          puVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_e8.field_2._M_allocated_capacity = *puVar13;
            local_e8.field_2._8_8_ = puVar9[3];
          }
          else {
            local_e8.field_2._M_allocated_capacity = *puVar13;
            local_e8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_e8._M_string_length = puVar9[1];
          *puVar9 = puVar13;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          ToSQLString_abi_cxx11_(&local_c8,pvVar11);
          uVar17 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            uVar17 = local_e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < local_c8._M_string_length + local_e8._M_string_length) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              uVar17 = local_c8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_c8._M_string_length + local_e8._M_string_length)
            goto LAB_002dd2e1;
            puVar9 = (undefined8 *)
                     ::std::__cxx11::string::replace
                               ((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8._M_dataplus._M_p);
          }
          else {
LAB_002dd2e1:
            puVar9 = (undefined8 *)
                     ::std::__cxx11::string::_M_append
                               ((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
          }
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          puVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_108.field_2._M_allocated_capacity = *puVar13;
            local_108.field_2._8_8_ = puVar9[3];
          }
          else {
            local_108.field_2._M_allocated_capacity = *puVar13;
            local_108._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_108._M_string_length = puVar9[1];
          *puVar9 = puVar13;
          puVar9[1] = 0;
          *(char *)puVar13 = '\0';
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
          psVar6 = &local_a0;
          _Var18._M_p = local_a0._M_dataplus._M_p;
        }
        else {
          ToSQLString_abi_cxx11_(&local_108,pvVar11);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
          psVar6 = &local_108;
          _Var18._M_p = local_108._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var18._M_p != &psVar6->field_2) {
          operator_delete(_Var18._M_p);
        }
        uVar12 = (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start >> 6;
        if (uVar19 < uVar12 - 1) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar12 = (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar12);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case LIST:
    local_a8 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
    pvVar10 = ListValue::GetChildren(this);
    if ((pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar19 = 0;
      do {
        pvVar11 = vector<duckdb::Value,_true>::operator[](pvVar10,uVar19);
        ToSQLString_abi_cxx11_(&local_108,pvVar11);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        uVar12 = (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start >> 6;
        if (uVar19 < uVar12 - 1) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar12 = (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar12);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  case MAP:
  case TABLE:
  case AGGREGATE_STATE:
  case LAMBDA:
  case UNION:
    goto switchD_002dd0e1_caseD_15;
  case ENUM:
    goto switchD_002dd0e1_caseD_19;
  case ARRAY:
    local_a8 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
    pvVar10 = ArrayValue::GetChildren(this);
    if ((pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar19 = 0;
      do {
        pvVar11 = vector<duckdb::Value,_true>::operator[](pvVar10,uVar19);
        ToSQLString_abi_cxx11_(&local_108,pvVar11);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        uVar12 = (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start >> 6;
        if (uVar19 < uVar12 - 1) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          uVar12 = (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pvVar10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                         super__Vector_impl_data._M_start >> 6;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar12);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  default:
    if (LVar3 != UUID) goto switchD_002dd0e1_caseD_15;
  }
switchD_002dd0e1_caseD_f:
  ToString_abi_cxx11_(&local_a0,this);
  plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,0x13728a6);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_e8.field_2._M_allocated_capacity = *puVar13;
    local_e8.field_2._8_8_ = plVar8[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *puVar13;
    local_e8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_e8._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar9 = (undefined8 *)::std::__cxx11::string::append((char *)&local_e8);
  paVar1 = &local_108.field_2;
  puVar13 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_108.field_2._M_allocated_capacity = *puVar13;
    local_108.field_2._8_8_ = puVar9[3];
    local_108._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_108.field_2._M_allocated_capacity = *puVar13;
    local_108._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_108._M_string_length = puVar9[1];
  *puVar9 = puVar13;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  LogicalType::ToString_abi_cxx11_(&local_c8,&this->type_);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    uVar17 = local_108.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_c8._M_string_length + local_108._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar17 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_c8._M_string_length + local_108._M_string_length) goto LAB_002dd4cc;
    puVar9 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_c8,0,(char *)0x0,(ulong)local_108._M_dataplus._M_p);
  }
  else {
LAB_002dd4cc:
    puVar9 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_c8._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar14 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar14) {
    uVar17 = puVar9[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar17;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar9;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
  }
  __return_storage_ptr__->_M_string_length = puVar9[1];
  *puVar9 = psVar14;
  puVar9[1] = 0;
  *(undefined1 *)psVar14 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
LAB_002dd552:
    operator_delete(local_e8._M_dataplus._M_p);
  }
LAB_002dd557:
  psVar6 = &local_a0;
LAB_002dd55c:
  puVar4 = (undefined1 *)(&(psVar6->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 != &psVar6->field_2) {
    operator_delete(puVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

string Value::ToSQLString() const {
	if (IsNull()) {
		return ToString();
	}
	switch (type_.id()) {
	case LogicalTypeId::UUID:
	case LogicalTypeId::DATE:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIME_TZ:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::INTERVAL:
	case LogicalTypeId::BLOB:
		return "'" + ToString() + "'::" + type_.ToString();
	case LogicalTypeId::VARCHAR:
	case LogicalTypeId::ENUM: {
		auto str_val = ToString();
		if (str_val.size() == 1 && str_val[0] == '\0') {
			return "chr(0)";
		}
		return "'" + StringUtil::Replace(ToString(), "'", "''") + "'";
	}
	case LogicalTypeId::STRUCT: {
		bool is_unnamed = StructType::IsUnnamed(type_);
		string ret = is_unnamed ? "(" : "{";
		auto &child_types = StructType::GetChildTypes(type_);
		auto &struct_values = StructValue::GetChildren(*this);
		for (idx_t i = 0; i < struct_values.size(); i++) {
			auto &name = child_types[i].first;
			auto &child = struct_values[i];
			if (is_unnamed) {
				ret += child.ToSQLString();
			} else {
				ret += "'" + name + "': " + child.ToSQLString();
			}
			if (i < struct_values.size() - 1) {
				ret += ", ";
			}
		}
		ret += is_unnamed ? ")" : "}";
		return ret;
	}
	case LogicalTypeId::FLOAT:
		if (!FloatIsFinite(FloatValue::Get(*this))) {
			return "'" + ToString() + "'::" + type_.ToString();
		}
		return ToString();
	case LogicalTypeId::DOUBLE: {
		double val = DoubleValue::Get(*this);
		if (!DoubleIsFinite(val)) {
			if (!Value::IsNan(val)) {
				// to infinity and beyond
				return val < 0 ? "-1e1000" : "1e1000";
			}
			return "'" + ToString() + "'::" + type_.ToString();
		}
		return ToString();
	}
	case LogicalTypeId::LIST: {
		string ret = "[";
		auto &list_values = ListValue::GetChildren(*this);
		for (idx_t i = 0; i < list_values.size(); i++) {
			auto &child = list_values[i];
			ret += child.ToSQLString();
			if (i < list_values.size() - 1) {
				ret += ", ";
			}
		}
		ret += "]";
		return ret;
	}
	case LogicalTypeId::ARRAY: {
		string ret = "[";
		auto &array_values = ArrayValue::GetChildren(*this);
		for (idx_t i = 0; i < array_values.size(); i++) {
			auto &child = array_values[i];
			ret += child.ToSQLString();
			if (i < array_values.size() - 1) {
				ret += ", ";
			}
		}
		ret += "]";
		return ret;
	}
	default:
		return ToString();
	}
}